

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readValue(OurReader *this)

{
  ulong uVar1;
  Value *pVVar2;
  Value *pVVar3;
  OurReader *this_00;
  long in_RDI;
  Value v_3;
  Value v_2;
  Value v_1;
  Value v;
  bool successful;
  Token token;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  OurReader *in_stack_fffffffffffffe50;
  allocator *paVar4;
  Value *in_stack_fffffffffffffe58;
  ValueType type;
  Value *in_stack_fffffffffffffe60;
  Value *in_stack_fffffffffffffe80;
  Location in_stack_fffffffffffffea8;
  Token *in_stack_fffffffffffffeb0;
  OurReader *in_stack_fffffffffffffec0;
  Token *in_stack_fffffffffffffed0;
  OurReader *in_stack_fffffffffffffed8;
  Token *in_stack_ffffffffffffff40;
  OurReader *in_stack_ffffffffffffff48;
  bool local_61;
  int local_60;
  long local_58;
  long local_50;
  undefined1 local_31 [48];
  byte local_1;
  
  if (*(int *)(in_RDI + 0x114) <= *(int *)(in_RDI + 0x108)) {
    in_stack_fffffffffffffec0 = (OurReader *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),"Exceeded stackLimit in readValue().",
               (allocator *)in_stack_fffffffffffffec0);
    throwRuntimeError((string *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
  }
  *(int *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x108) + 1;
  skipCommentTokens(in_stack_fffffffffffffe50,
                    (Token *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  local_61 = true;
  if (((*(byte *)(in_RDI + 0x118) & 1) != 0) &&
     (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    currentValue((OurReader *)0x132624);
    Value::setComment(in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58,
                      (CommentPlacement)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"");
  }
  this_00 = (OurReader *)(ulong)(local_60 - 1);
  type = (ValueType)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  switch(this_00) {
  case (OurReader *)0x0:
    local_61 = readObject((OurReader *)v_3._8_8_,v_3.value_);
    pVVar3 = currentValue((OurReader *)0x1326b1);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  case (OurReader *)0x1:
  case (OurReader *)0x3:
  case (OurReader *)0x9:
    if ((*(byte *)(in_RDI + 0x10e) & 1) == 0) goto switchD_00132684_default;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + -1;
    Value::Value(in_stack_fffffffffffffe60,type);
    currentValue((OurReader *)0x132a64);
    Value::swapPayload(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    pVVar3 = currentValue((OurReader *)0x132a8c);
    Value::setOffsetStart(pVVar3,~*(ulong *)(in_RDI + 0xc0) + *(long *)(in_RDI + 0xd0));
    pVVar3 = currentValue((OurReader *)0x132ac8);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    Value::~Value(in_stack_fffffffffffffe80);
    break;
  case (OurReader *)0x2:
    local_61 = readArray(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    pVVar3 = currentValue((OurReader *)0x132702);
    Value::setOffsetLimit(pVVar3,*(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xc0));
    break;
  case (OurReader *)0x4:
    local_61 = decodeString(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    break;
  case (OurReader *)0x5:
    local_61 = decodeNumber(this_00,in_stack_fffffffffffffeb0);
    break;
  case (OurReader *)0x6:
    Value::Value((Value *)in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
    currentValue((OurReader *)0x13278d);
    Value::swapPayload(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    pVVar3 = currentValue((OurReader *)0x1327b5);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1327ef);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value(in_stack_fffffffffffffe80);
    break;
  case (OurReader *)0x7:
    Value::Value((Value *)in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
    currentValue((OurReader *)0x132870);
    Value::swapPayload(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    pVVar3 = currentValue((OurReader *)0x132898);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x1328d2);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value(in_stack_fffffffffffffe80);
    break;
  case (OurReader *)0x8:
    Value::Value(in_stack_fffffffffffffe60,type);
    pVVar3 = currentValue((OurReader *)0x132953);
    Value::swapPayload(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    pVVar2 = currentValue((OurReader *)0x13297b);
    Value::setOffsetStart(pVVar2,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar2 = currentValue((OurReader *)0x1329b5);
    Value::setOffsetLimit(pVVar2,local_50 - *(long *)(in_RDI + 0xc0));
    Value::~Value(pVVar3);
    break;
  default:
switchD_00132684_default:
    pVVar3 = currentValue((OurReader *)0x132b3b);
    Value::setOffsetStart(pVVar3,local_58 - *(long *)(in_RDI + 0xc0));
    pVVar3 = currentValue((OurReader *)0x132b6a);
    Value::setOffsetLimit(pVVar3,local_50 - *(long *)(in_RDI + 0xc0));
    paVar4 = (allocator *)&stack0xfffffffffffffed7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffed8,"Syntax error: value, object or array expected.",
               paVar4);
    local_1 = addError(in_stack_fffffffffffffec0,(string *)this_00,in_stack_fffffffffffffeb0,
                       in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
    goto LAB_00132cb7;
  }
  if ((*(byte *)(in_RDI + 0x118) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(in_RDI + 0xd0);
    pVVar3 = currentValue((OurReader *)0x132c7e);
    *(Value **)(in_RDI + 0xe0) = pVVar3;
  }
  *(int *)(in_RDI + 0x108) = *(int *)(in_RDI + 0x108) + -1;
  local_1 = local_61;
LAB_00132cb7:
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::readValue() {
  if (stackDepth_ >= features_.stackLimit_) throwRuntimeError("Exceeded stackLimit in readValue().");
  ++stackDepth_;
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenFalse:
    {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenNull:
    {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // else, fall through ...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  --stackDepth_;
  return successful;
}